

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockingDirectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDirectionSyntax,slang::parsing::Token&,slang::syntax::ClockingSkewSyntax*&,slang::parsing::Token&,slang::syntax::ClockingSkewSyntax*&>
          (BumpAllocator *this,Token *args,ClockingSkewSyntax **args_1,Token *args_2,
          ClockingSkewSyntax **args_3)

{
  ClockingSkewSyntax *pCVar1;
  ClockingSkewSyntax *pCVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ClockingDirectionSyntax *pCVar13;
  
  pCVar13 = (ClockingDirectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingDirectionSyntax *)this->endPtr < pCVar13 + 1) {
    pCVar13 = (ClockingDirectionSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pCVar13 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar3 = args->info;
  pCVar1 = *args_1;
  TVar9 = args_2->kind;
  uVar10 = args_2->field_0x2;
  NVar11.raw = (args_2->numFlags).raw;
  uVar12 = args_2->rawLen;
  pIVar4 = args_2->info;
  pCVar2 = *args_3;
  (pCVar13->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar13->super_SyntaxNode).kind = ClockingDirection;
  (pCVar13->input).kind = TVar5;
  (pCVar13->input).field_0x2 = uVar6;
  (pCVar13->input).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar13->input).rawLen = uVar8;
  (pCVar13->input).info = pIVar3;
  pCVar13->inputSkew = pCVar1;
  (pCVar13->output).kind = TVar9;
  (pCVar13->output).field_0x2 = uVar10;
  (pCVar13->output).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar13->output).rawLen = uVar12;
  (pCVar13->output).info = pIVar4;
  pCVar13->outputSkew = pCVar2;
  if (pCVar1 != (ClockingSkewSyntax *)0x0) {
    (pCVar1->super_SyntaxNode).parent = &pCVar13->super_SyntaxNode;
  }
  if (pCVar2 != (ClockingSkewSyntax *)0x0) {
    (pCVar2->super_SyntaxNode).parent = &pCVar13->super_SyntaxNode;
  }
  return pCVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }